

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::Deferred<Fixpp::ErrorKind>::
construct<Fixpp::ErrorKind::Type&,unsigned_long&,std::__cxx11::string>
          (Deferred<Fixpp::ErrorKind> *this,Type *args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  undefined8 *puVar1;
  Type TVar2;
  unsigned_long uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar2 = *args;
  uVar3 = *args_1;
  std::__cxx11::string::string(&local_48,args_2);
  *(Type *)&this->storage_ = TVar2;
  *(unsigned_long *)((long)&this->storage_ + 8) = uVar3;
  puVar1 = (undefined8 *)((long)&this->storage_ + 0x20);
  *(undefined8 **)((long)&this->storage_ + 0x10) = puVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    *puVar1 = CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]
                      );
    *(undefined8 *)((long)&this->storage_ + 0x28) = local_48.field_2._8_8_;
  }
  else {
    *(pointer *)((long)&this->storage_ + 0x10) = local_48._M_dataplus._M_p;
    *(ulong *)((long)&this->storage_ + 0x20) =
         CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
  }
  *(size_type *)((long)&this->storage_ + 0x18) = local_48._M_string_length;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::~string((string *)&local_48);
  this->empty_ = false;
  return;
}

Assistant:

void construct(Args&& ...args)
        {
            new (&storage_) T(std::forward<Args>(args)...);
            empty_ = false;
        }